

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.h
# Opt level: O0

void __thiscall sundials::Context::Context(Context *this,void *comm)

{
  undefined8 *puVar1;
  void *in_RSI;
  unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_> *in_stack_ffffffffffffffa8;
  unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_> *in_stack_ffffffffffffffb0;
  unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_> *this_00;
  unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_> local_18;
  void *local_10;
  
  local_10 = in_RSI;
  std::unique_ptr<_SUNContext*,std::default_delete<_SUNContext*>>::
  unique_ptr<std::default_delete<_SUNContext*>,void>(in_stack_ffffffffffffffb0);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = 0;
  this_00 = &local_18;
  std::unique_ptr<_SUNContext*,std::default_delete<_SUNContext*>>::
  unique_ptr<std::default_delete<_SUNContext*>,void>(this_00,(pointer)in_stack_ffffffffffffffa8);
  std::unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_>::operator=
            (this_00,in_stack_ffffffffffffffa8);
  std::unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_>::~unique_ptr(this_00);
  std::unique_ptr<_SUNContext_*,_std::default_delete<_SUNContext_*>_>::get(this_00);
  SUNContext_Create(local_10,(SUNContext *)this_00);
  return;
}

Assistant:

explicit Context(void* comm = NULL)
  {
    sunctx_ = std::unique_ptr<SUNContext>(new SUNContext());
    SUNContext_Create(comm, sunctx_.get());
  }